

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void __thiscall
testing::internal::MatcherBase<const_(anonymous_namespace)::SerializeSpanFallback::simple_struct_&>
::~MatcherBase(MatcherBase<const_(anonymous_namespace)::SerializeSpanFallback::simple_struct_&>
               *this)

{
  MatcherBase<const_(anonymous_namespace)::SerializeSpanFallback::simple_struct_&> *this_local;
  
  ~MatcherBase(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

~MatcherBase() override { Destroy(); }